

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int handleAlias(poptContext con,char *longName,size_t longNameLen,char shortName,char *nextArg)

{
  optionStackEntry *poVar1;
  poptItem ppVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char **argv;
  ulong uVar6;
  long lVar7;
  uint argc;
  poptItem opt;
  
  poVar1 = con->os;
  ppVar2 = poVar1->currAlias;
  if ((ppVar2 != (poptItem)0x0) &&
     ((((longName != (char *)0x0 && ((ppVar2->option).longName != (char *)0x0)) &&
       (iVar4 = longOptionStrcmp(&ppVar2->option,longName,longNameLen), iVar4 != 0)) ||
      ((shortName != '\0' && ((ppVar2->option).shortName == shortName)))))) {
    return 0;
  }
  ppVar2 = con->aliases;
  if (ppVar2 == (poptItem)0x0) {
    return 0;
  }
  iVar4 = con->numAliases;
  if (iVar4 < 1) {
    return 0;
  }
  opt = ppVar2 + (iVar4 - 1);
  uVar6 = (ulong)(iVar4 - 1);
  do {
    if (longName == (char *)0x0) {
      if ((opt->option).shortName == shortName) goto LAB_0010468e;
    }
    else if (((opt->option).longName != (char *)0x0) &&
            (iVar5 = longOptionStrcmp(&opt->option,longName,longNameLen), iVar5 != 0))
    goto LAB_0010468e;
    iVar4 = iVar4 + -1;
    opt = opt + -1;
    bVar3 = 0 < (long)uVar6;
    uVar6 = uVar6 - 1;
  } while (bVar3);
  uVar6 = 0xffffffff;
  iVar4 = 0;
LAB_0010468e:
  if (iVar4 < 1) {
    return 0;
  }
  if ((long)poVar1 - (long)con == 0x240) {
    return -0xd;
  }
  if ((nextArg != (char *)0x0 && longName == (char *)0x0) && (*nextArg != '\0')) {
    poVar1->nextCharArg = nextArg;
  }
  con->os = poVar1 + 1;
  poVar1[1].next = 0;
  poVar1[1].stuffed = 0;
  poVar1[1].nextArg = (char *)0x0;
  poVar1[1].nextCharArg = (char *)0x0;
  poVar1[1].currAlias = ppVar2 + (uVar6 & 0xffffffff);
  argc = ppVar2[uVar6 & 0xffffffff].argc;
  if ((longName != (char *)0x0 && nextArg != (char *)0x0) && (*nextArg != '\0')) {
    lVar7 = (long)(int)argc;
    argv = (char **)malloc(lVar7 * 8 + 0x10);
    if (argv != (char **)0x0) {
      if (0 < (int)argc) {
        uVar6 = 0;
        do {
          argv[uVar6] = (poVar1[1].currAlias)->argv[uVar6];
          uVar6 = uVar6 + 1;
        } while (argc != uVar6);
      }
      argc = argc + 1;
      argv[lVar7] = nextArg;
      argv[lVar7 + 1] = (char *)0x0;
      goto LAB_00104776;
    }
  }
  argv = ppVar2[uVar6 & 0xffffffff].argv;
LAB_00104776:
  iVar4 = poptDupArgv(argc,argv,&poVar1[1].argc,&poVar1[1].argv);
  if ((argv != (char **)0x0) && (argv != con->os->currAlias->argv)) {
    free(argv);
  }
  con->os->argb = (pbm_set *)0x0;
  return iVar4 + (uint)(iVar4 == 0);
}

Assistant:

static int handleAlias(poptContext con,
		const char * longName, size_t longNameLen,
		char shortName,
		const char * nextArg)
{
    poptItem item = con->os->currAlias;
    int rc;
    int i;

    if (item) {
	if (longName && item->option.longName != NULL
	 && longOptionStrcmp(&item->option, longName, longNameLen))
	    return 0;
	else
	if (shortName && shortName == item->option.shortName)
	    return 0;
    }

    if (con->aliases == NULL || con->numAliases <= 0) /* XXX can't happen */
	return 0;

    for (i = con->numAliases - 1; i >= 0; i--) {
	item = con->aliases + i;
	if (longName) {
	    if (item->option.longName == NULL)
		continue;
	    if (!longOptionStrcmp(&item->option, longName, longNameLen))
		continue;
	} else if (shortName != item->option.shortName)
	    continue;
	break;
    }
    if (i < 0) return 0;

    if ((con->os - con->optionStack + 1) == POPT_OPTION_DEPTH)
	return POPT_ERROR_OPTSTOODEEP;

    if (longName == NULL && nextArg != NULL && *nextArg != '\0')
	con->os->nextCharArg = nextArg;

    con->os++;
    con->os->next = 0;
    con->os->stuffed = 0;
    con->os->nextArg = NULL;
    con->os->nextCharArg = NULL;
    con->os->currAlias = con->aliases + i;
    {	const char ** av;
	int ac = con->os->currAlias->argc;
	/* Append --foo=bar arg to alias argv array (if present). */ 
	if (longName && nextArg != NULL && *nextArg != '\0') {
	    av = malloc((ac + 1 + 1) * sizeof(*av));
	    if (av != NULL) {	/* XXX won't happen. */
		for (i = 0; i < ac; i++) {
		    av[i] = con->os->currAlias->argv[i];
		}
		av[ac++] = nextArg;
		av[ac] = NULL;
	    } else	/* XXX revert to old popt behavior if malloc fails. */
		av = con->os->currAlias->argv;
	} else
	    av = con->os->currAlias->argv;
	rc = poptDupArgv(ac, av, &con->os->argc, &con->os->argv);
	if (av != NULL && av != con->os->currAlias->argv)
	    free(av);
    }
    con->os->argb = NULL;

    return (rc ? rc : 1);
}